

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.cpp
# Opt level: O2

void __thiscall NaPolynomialFunc::Function(NaPolynomialFunc *this,NaReal *x,NaReal *y)

{
  NaDynAr<double> *pNVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int i;
  uint uVar3;
  double dVar4;
  
  if ((this->vfK).nItems == 0) {
    *y = *x;
  }
  else {
    pNVar1 = &this->vfK;
    iVar2 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,0);
    *y = *(NaReal *)CONCAT44(extraout_var,iVar2);
    dVar4 = 1.0;
    for (uVar3 = 1; (int)uVar3 < (this->vfK).nItems; uVar3 = uVar3 + 1) {
      dVar4 = dVar4 * *x;
      iVar2 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar3);
      *y = *(double *)CONCAT44(extraout_var_00,iVar2) * dVar4 + *y;
    }
  }
  return;
}

Assistant:

void
NaPolynomialFunc::Function (NaReal* x, NaReal* y)
{
    NaReal	xi = 1;
    if(vfK.count() == 0)
	*y = *x;
    else {
	*y = vfK[0];
	NaReal xi = 1;
	for(int i = 1; i < vfK.count(); ++i) {
	    xi *= *x;
	    *y += vfK[i] * xi;
	}
    }
}